

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O2

Vec_Ptr_t * Sim_ComputeFunSupp(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint *puVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Sim_Man_t *p;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Ntk_t *pNtk_01;
  Fraig_Man_t *p_00;
  abctime aVar11;
  int *piVar12;
  ulong uVar13;
  Abc_Obj_t *pAVar14;
  Sim_Pat_t *pSVar15;
  abctime aVar16;
  ulong uVar17;
  void *pvVar18;
  int iVar19;
  int Out;
  long lVar20;
  long lVar21;
  Fraig_Params_t local_70;
  
  aVar7 = Abc_Clock();
  srand(0xabc);
  p = Sim_ManStart(pNtk,0);
  Sim_UtilAssignRandom(p);
  Sim_ComputeSuppRound(p,0);
  for (pvVar18 = (void *)0x0; (long)pvVar18 < (long)p->pNtk->vCos->nSize;
      pvVar18 = (void *)((long)pvVar18 + 1)) {
    pAVar8 = Abc_NtkCo(p->pNtk,(int)pvVar18);
    Sim_UtilInfoDetectNews
              ((uint *)p->vSuppFun->pArray[(long)pvVar18],(uint *)p->vSuppStr->pArray[pAVar8->Id],
               p->nSuppWords,p->vDiffs);
    for (iVar19 = 0; iVar19 < p->vDiffs->nSize; iVar19 = iVar19 + 1) {
      iVar3 = Vec_IntEntry(p->vDiffs,iVar19);
      pVVar10 = (Vec_Ptr_t *)p->vSuppTargs;
      if (pVVar10->nSize <= iVar3) {
        Vec_PtrGrow(pVVar10,iVar3 + 1);
        for (lVar21 = (long)pVVar10->nSize; lVar21 <= iVar3; lVar21 = lVar21 + 1) {
          pvVar9 = calloc(1,0x10);
          pVVar10->pArray[lVar21] = pvVar9;
        }
        pVVar10->nSize = iVar3 + 1;
      }
      pVVar10 = Vec_VecEntry((Vec_Vec_t *)pVVar10,iVar3);
      Vec_PtrPush(pVVar10,pvVar18);
    }
  }
  if (fVerbose != 0) {
    uVar4 = Vec_VecSizeSize(p->vSuppTargs);
    printf("Number of support targets after simulation = %5d.\n",(ulong)uVar4);
  }
  iVar19 = Vec_VecSizeSize(p->vSuppTargs);
  if (iVar19 != 0) {
    Sim_UtilAssignRandom(p);
    uVar4 = Sim_ComputeSuppRound(p,1);
    iVar19 = Vec_VecSizeSize(p->vSuppTargs);
    if (iVar19 != 0) {
      if (fVerbose != 0) {
        uVar5 = Vec_VecSizeSize(p->vSuppTargs);
        printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",(ulong)uVar5,(ulong)uVar4,
               (ulong)(uint)p->vFifo->nSize);
      }
      while (iVar19 = Vec_VecSizeSize(p->vSuppTargs), 0 < iVar19) {
        p->nSatRuns = 0;
        for (lVar21 = 0; lVar21 < p->vSuppTargs->nSize; lVar21 = lVar21 + 1) {
          iVar3 = (int)lVar21;
          pVVar10 = Vec_VecEntry(p->vSuppTargs,iVar3);
          iVar19 = pVVar10->nSize;
          while (0 < iVar19) {
            iVar19 = iVar19 + -1;
            pVVar10 = Vec_VecEntry(p->vSuppTargs,iVar3);
            pvVar18 = Vec_PtrEntry(pVVar10,iVar19);
            p->nSatRuns = p->nSatRuns + 1;
            Out = (int)pvVar18;
            pNtk_01 = Abc_NtkMiterForCofactors(p->pNtk,Out,iVar3,-1);
            Fraig_ParamsSetDefault(&local_70);
            local_70.nSeconds = 1000000000;
            local_70.fInternal = 1;
            aVar16 = Abc_Clock();
            p_00 = (Fraig_Man_t *)Abc_NtkToFraig(pNtk_01,&local_70,0,0);
            aVar11 = Abc_Clock();
            p->timeFraig = p->timeFraig + (aVar11 - aVar16);
            aVar16 = Abc_Clock();
            Fraig_ManProveMiter(p_00);
            aVar11 = Abc_Clock();
            p->timeSat = p->timeSat + (aVar11 - aVar16);
            iVar6 = Fraig_ManCheckMiter(p_00);
            if (iVar6 < 0) {
              __assert_fail("RetValue >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                            ,0x1e5,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
            }
            if (iVar6 == 1) {
              p->nSatRunsUnsat = p->nSatRunsUnsat + 1;
              Vec_PtrRemove((Vec_Ptr_t *)p->vSuppTargs->pArray[lVar21],pvVar18);
            }
            else {
              p->nSatRunsSat = p->nSatRunsSat + 1;
              piVar12 = Fraig_ManReadModel(p_00);
              if (piVar12 == (int *)0x0) {
                __assert_fail("pModel != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                              ,0x1f0,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
              }
              pNtk_00 = p->pNtk;
              if ((pNtk_00->vTravIds).pArray == (int *)0x0) {
                uVar4 = pNtk_00->vObjs->nSize + 500;
                Vec_IntGrow(&pNtk_00->vTravIds,uVar4);
                uVar13 = 0;
                if (0 < (int)uVar4) {
                  uVar13 = (ulong)uVar4;
                }
                for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
                  (pNtk_00->vTravIds).pArray[uVar17] = 0;
                }
                (pNtk_00->vTravIds).nSize = uVar4;
              }
              iVar2 = pNtk_00->nTravIds;
              pNtk_00->nTravIds = iVar2 + 1;
              if (0x3ffffffe < iVar2) {
                __assert_fail("p->nTravIds < (1<<30)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                              ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
              }
              for (lVar20 = 0; lVar20 < pNtk_00->vCis->nSize; lVar20 = lVar20 + 1) {
                pAVar8 = Abc_NtkCi(pNtk_00,(int)lVar20);
                Abc_NodeSetTravIdCurrent(pAVar8);
                pAVar14 = Abc_NtkCi(pNtk_00,iVar3);
                if (pAVar8 == pAVar14) {
                  pAVar8->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
                }
                else if (piVar12[lVar20] == 1) {
                  pAVar8->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x3;
                }
                else {
                  (pAVar8->field_6).pTemp = (void *)0x0;
                }
              }
              pAVar8 = Abc_NtkCo(pNtk_00,Out);
              uVar4 = Sim_NtkSimTwoPats_rec
                                ((Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray]
                                );
              if ((uVar4 & 3) - 3 < 0xfffffffe) {
                __assert_fail("Sim_SolveSuppModelVerify( p->pNtk, pModel, Input, Output )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                              ,0x1f1,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
              }
              pSVar15 = Sim_ManPatAlloc(p);
              pSVar15->Input = iVar3;
              pSVar15->Output = Out;
              for (uVar13 = 0; (long)uVar13 < (long)p->pNtk->vCis->nSize; uVar13 = uVar13 + 1) {
                Abc_NtkCi(p->pNtk,(int)uVar13);
                if (piVar12[uVar13] != 0) {
                  pSVar15->pData[uVar13 >> 5 & 0x7ffffff] =
                       pSVar15->pData[uVar13 >> 5 & 0x7ffffff] | 1 << ((byte)uVar13 & 0x1f);
                }
              }
              Vec_PtrPush(p->vFifo,pSVar15);
            }
            Fraig_ManFree(p_00);
            Abc_NtkDelete(pNtk_01);
            p->iInput = iVar3;
            if (iVar6 != 1) goto LAB_00406fcc;
          }
        }
LAB_00406fcc:
        iVar19 = 0;
        do {
          pVVar10 = p->vFifo;
          if (pVVar10->nSize < 1) break;
          uVar4 = pVVar10->nSize - 1;
          pVVar10->nSize = uVar4;
          pSVar15 = (Sim_Pat_t *)pVVar10->pArray[uVar4];
          lVar21 = (long)iVar19;
          iVar19 = iVar19 + p->nSuppWords;
          if (p->nSimWords <= iVar19) {
            iVar19 = p->nSimWords;
          }
          uVar13 = 0;
          while( true ) {
            uVar4 = (uint)uVar13;
            if (p->pNtk->vCis->nSize <= (int)uVar4) break;
            pAVar8 = Abc_NtkCi(p->pNtk,uVar4);
            pvVar18 = p->vSim0->pArray[pAVar8->Id];
            lVar20 = lVar21;
            if ((pSVar15->pData[uVar13 >> 5] >> (uVar4 & 0x1f) & 1) == 0) {
              for (; lVar20 < iVar19; lVar20 = lVar20 + 1) {
                *(undefined4 *)((long)pvVar18 + lVar20 * 4) = 0;
              }
            }
            else {
              for (; lVar20 < iVar19; lVar20 = lVar20 + 1) {
                *(undefined4 *)((long)pvVar18 + lVar20 * 4) = 0xffffffff;
              }
            }
            puVar1 = (uint *)((long)pvVar18 + (uVar13 >> 5) * 4 + lVar21 * 4);
            *puVar1 = *puVar1 ^ 1 << ((byte)uVar13 & 0x1f);
            uVar13 = (ulong)(uVar4 + 1);
          }
          Sim_ManPatFree(p,pSVar15);
        } while (iVar19 != p->nSimWords);
        uVar4 = Sim_ComputeSuppRound(p,1);
        if (fVerbose != 0) {
          uVar5 = Vec_VecSizeSize(p->vSuppTargs);
          printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n",(ulong)uVar5,
                 (ulong)uVar4,(ulong)(uint)p->vFifo->nSize,(ulong)(uint)p->nSatRuns);
        }
      }
    }
  }
  aVar16 = Abc_Clock();
  p->timeTotal = aVar16 - aVar7;
  pVVar10 = p->vSuppFun;
  Sim_ManStop(p);
  return pVVar10;
}

Assistant:

Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sim_Man_t * p;
    Vec_Ptr_t * vResult;
    int nSolved, i;
    abctime clk = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sim_ManStart( pNtk, 0 );

    // compute functional support using one round of random simulation
    Sim_UtilAssignRandom( p );
    Sim_ComputeSuppRound( p, 0 );

    // set the support targets 
    Sim_ComputeSuppSetTargets( p );
    if ( fVerbose )
        printf( "Number of support targets after simulation = %5d.\n", Vec_VecSizeSize(p->vSuppTargs) );
    if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
        goto exit;

    for ( i = 0; i < 1; i++ )
    {
        // compute patterns using one round of random simulation
        Sim_UtilAssignRandom( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );
        if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
            goto exit;

        if ( fVerbose )
            printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",
                Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo) );
    }

    // try to solve the support targets
    while ( Vec_VecSizeSize(p->vSuppTargs) > 0 )
    {
        // solve targets until the first disproved one (which gives counter-example)
        Sim_SolveTargetsUsingSat( p, p->nSimWords/p->nSuppWords );
        // compute additional functional support
        Sim_UtilAssignFromFifo( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );

if ( fVerbose )
    printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n", 
            Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo), p->nSatRuns );
    }

exit:
p->timeTotal = Abc_Clock() - clk;
    vResult = p->vSuppFun;  
    //  p->vSuppFun = NULL;
    Sim_ManStop( p );
    return vResult;
}